

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::SetColorEditOptions(ImGuiColorEditFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiContext *g;
  ImGuiColorEditFlags flags_local;
  
  pIVar1 = GImGui;
  g._4_4_ = flags;
  if ((flags & 0x700000U) == 0) {
    g._4_4_ = flags | 0x100000;
  }
  if ((g._4_4_ & 0x1800000) == 0) {
    g._4_4_ = g._4_4_ | 0x800000;
  }
  if ((g._4_4_ & 0x6000000) == 0) {
    g._4_4_ = g._4_4_ | 0x2000000;
  }
  if ((g._4_4_ & 0x18000000) == 0) {
    g._4_4_ = g._4_4_ | 0x8000000;
  }
  bVar2 = ImIsPowerOfTwo(g._4_4_ & 0x700000);
  if (!bVar2) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags_DisplayMask_)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                  ,0x15ba,"void ImGui::SetColorEditOptions(ImGuiColorEditFlags)");
  }
  bVar2 = ImIsPowerOfTwo(g._4_4_ & 0x1800000);
  if (!bVar2) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags_DataTypeMask_)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                  ,0x15bb,"void ImGui::SetColorEditOptions(ImGuiColorEditFlags)");
  }
  bVar2 = ImIsPowerOfTwo(g._4_4_ & 0x6000000);
  if (!bVar2) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags_PickerMask_)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                  ,0x15bc,"void ImGui::SetColorEditOptions(ImGuiColorEditFlags)");
  }
  bVar2 = ImIsPowerOfTwo(g._4_4_ & 0x18000000);
  if (!bVar2) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags_InputMask_)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                  ,0x15bd,"void ImGui::SetColorEditOptions(ImGuiColorEditFlags)");
  }
  pIVar1->ColorEditOptions = g._4_4_;
  return;
}

Assistant:

void ImGui::SetColorEditOptions(ImGuiColorEditFlags flags)
{
    ImGuiContext& g = *GImGui;
    if ((flags & ImGuiColorEditFlags_DisplayMask_) == 0)
        flags |= ImGuiColorEditFlags_DefaultOptions_ & ImGuiColorEditFlags_DisplayMask_;
    if ((flags & ImGuiColorEditFlags_DataTypeMask_) == 0)
        flags |= ImGuiColorEditFlags_DefaultOptions_ & ImGuiColorEditFlags_DataTypeMask_;
    if ((flags & ImGuiColorEditFlags_PickerMask_) == 0)
        flags |= ImGuiColorEditFlags_DefaultOptions_ & ImGuiColorEditFlags_PickerMask_;
    if ((flags & ImGuiColorEditFlags_InputMask_) == 0)
        flags |= ImGuiColorEditFlags_DefaultOptions_ & ImGuiColorEditFlags_InputMask_;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags_DisplayMask_));    // Check only 1 option is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags_DataTypeMask_));   // Check only 1 option is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags_PickerMask_));     // Check only 1 option is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags_InputMask_));      // Check only 1 option is selected
    g.ColorEditOptions = flags;
}